

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicState.cpp
# Opt level: O1

GraphicState * __thiscall GraphicState::operator=(GraphicState *this,GraphicState *inGraphicState)

{
  this->mFont = inGraphicState->mFont;
  this->mFontSize = inGraphicState->mFontSize;
  std::__cxx11::string::_M_assign((string *)&this->mPlacedFontName);
  this->mPlacedFontSize = inGraphicState->mPlacedFontSize;
  return this;
}

Assistant:

GraphicState& GraphicState::operator=(const GraphicState& inGraphicState)
{
	mFont = inGraphicState.mFont;
	mFontSize = inGraphicState.mFontSize;
	mPlacedFontName = inGraphicState.mPlacedFontName;
    mPlacedFontSize = inGraphicState.mPlacedFontSize;
	return *this;

}